

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O3

QPDFEFStreamObjectHelper *
QPDFEFStreamObjectHelper::newFromStream
          (QPDFEFStreamObjectHelper *__return_storage_ptr__,QPDFObjectHandle *stream)

{
  bool bVar1;
  qpdf_offset_t value;
  Pl_Count count;
  Pl_Discard discard;
  Pl_MD5 md5;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  string local_138;
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  undefined1 local_f8 [56];
  string local_c0;
  Pipeline local_a0;
  undefined1 local_70 [80];
  
  local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (stream->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (stream->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  QPDFEFStreamObjectHelper(__return_storage_ptr__,&local_118);
  if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_a0);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/Type","");
  local_f8._0_8_ = (long)local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"/EmbeddedFile","");
  QPDFObjectHandle::newName((QPDFObjectHandle *)local_158,(string *)local_f8);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)&local_a0,(string *)local_70,(QPDFObjectHandle *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.identifier._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.identifier._M_dataplus._M_p)
    ;
  }
  Pl_Discard::Pl_Discard((Pl_Discard *)&local_a0);
  Pl_MD5::Pl_MD5((Pl_MD5 *)local_70,"EF md5",&local_a0);
  Pl_Count::Pl_Count((Pl_Count *)local_f8,"EF size",(Pipeline *)local_70);
  bVar1 = QPDFObjectHandle::pipeStreamData
                    (stream,(Pipeline *)local_f8,(bool *)0x0,0,qpdf_dl_all,false,false);
  local_158._0_8_ = (element_type *)local_148;
  if (bVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/Size","");
    value = Pl_Count::getCount((Pl_Count *)local_f8);
    QPDFObjectHandle::newInteger((QPDFObjectHandle *)(local_148 + 0x10),value);
    setParam(__return_storage_ptr__,(string *)local_158,(QPDFObjectHandle *)(local_148 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
    }
    if ((element_type *)local_158._0_8_ != (element_type *)local_148) {
      operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
    }
    local_158._0_8_ = (element_type *)local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/CheckSum","");
    Pl_MD5::getHexDigest_abi_cxx11_(&local_c0,(Pl_MD5 *)local_70);
    QUtil::hex_decode((string *)(local_148 + 0x10),&local_c0);
    QPDFObjectHandle::newString(&local_108,(string *)(local_148 + 0x10));
    setParam(__return_storage_ptr__,(string *)local_158,&local_108);
    if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"unable to get stream data for new embedded file stream","");
    QPDFObjectHandle::warnIfPossible(stream,(string *)local_158);
  }
  if ((element_type *)local_158._0_8_ != (element_type *)local_148) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
  }
  Pl_Count::~Pl_Count((Pl_Count *)local_f8);
  Pl_MD5::~Pl_MD5((Pl_MD5 *)local_70);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

QPDFEFStreamObjectHelper
QPDFEFStreamObjectHelper::newFromStream(QPDFObjectHandle stream)
{
    QPDFEFStreamObjectHelper result(stream);
    stream.getDict().replaceKey("/Type", QPDFObjectHandle::newName("/EmbeddedFile"));
    Pl_Discard discard;
    // The PDF spec specifies use of MD5 here and notes that it is not to be used for security. MD5
    // is known to be insecure.
    Pl_MD5 md5("EF md5", &discard);
    Pl_Count count("EF size", &md5);
    if (!stream.pipeStreamData(&count, nullptr, 0, qpdf_dl_all)) {
        stream.warnIfPossible("unable to get stream data for new embedded file stream");
    } else {
        result.setParam("/Size", QPDFObjectHandle::newInteger(count.getCount()));
        result.setParam(
            "/CheckSum", QPDFObjectHandle::newString(QUtil::hex_decode(md5.getHexDigest())));
    }
    return result;
}